

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O0

void solver2_record(sat_solver2 *s,veci *cls,int proof_id)

{
  int iVar1;
  int *begin_00;
  cla local_34;
  cla Cid;
  lit *end;
  lit *begin;
  int proof_id_local;
  veci *cls_local;
  sat_solver2 *s_local;
  
  begin_00 = veci_begin(cls);
  iVar1 = veci_size(cls);
  local_34 = clause2_create_new(s,begin_00,begin_00 + iVar1,1,proof_id);
  iVar1 = veci_size(cls);
  if (0 < iVar1) {
    iVar1 = veci_size(cls);
    if (iVar1 == 1) {
      if (s->fProofLogging != 0) {
        iVar1 = lit_var(*begin_00);
        var_set_unit_clause(s,iVar1,local_34);
      }
      local_34 = 0;
    }
    solver2_enqueue(s,*begin_00,local_34);
    return;
  }
  __assert_fail("veci_size(cls) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                ,0x221,"void solver2_record(sat_solver2 *, veci *, int)");
}

Assistant:

static void solver2_record(sat_solver2* s, veci* cls, int proof_id)
{
    lit* begin = veci_begin(cls);
    lit* end   = begin + veci_size(cls);
    cla  Cid   = clause2_create_new(s,begin,end,1, proof_id);
    assert(veci_size(cls) > 0);
    if ( veci_size(cls) == 1 )
    {
        if ( s->fProofLogging )
            var_set_unit_clause(s, lit_var(begin[0]), Cid);
        Cid = 0;
    }
    solver2_enqueue(s, begin[0], Cid);
}